

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

String * __thiscall
Diligent::GetShaderDescString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,ShaderDesc *Desc)

{
  Char *pCVar1;
  char *local_58;
  char *local_48;
  ShaderDesc *Desc_local;
  String *Str;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"Name: \'");
  if (*(long *)this == 0) {
    local_48 = "<NULL>";
  }
  else {
    local_48 = *(char **)this;
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_48);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\'; Type: ");
  pCVar1 = GetShaderTypeLiteralName(*(SHADER_TYPE *)(this + 8));
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pCVar1);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"; combined samplers: ");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(byte)this[0xc] & 1 | 0x30);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"; sampler suffix: ");
  if (*(long *)(this + 0x10) == 0) {
    local_58 = "<NULL>";
  }
  else {
    local_58 = *(char **)(this + 0x10);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_58);
  return __return_storage_ptr__;
}

Assistant:

String GetShaderDescString(const ShaderDesc& Desc)
{
    String Str;
    Str += "Name: '";
    Str += Desc.Name != nullptr ? Desc.Name : "<NULL>";

    Str += "'; Type: ";
    Str += GetShaderTypeLiteralName(Desc.ShaderType);

    Str += "; combined samplers: ";
    Str += Desc.UseCombinedTextureSamplers ? '1' : '0';

    Str += "; sampler suffix: ";
    Str += Desc.CombinedSamplerSuffix != nullptr ? Desc.CombinedSamplerSuffix : "<NULL>";

    return Str;
}